

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O0

void __thiscall
slang::ast::Compilation::addSyntaxTree
          (Compilation *this,shared_ptr<slang::syntax::SyntaxTree> *tree)

{
  bool bVar1;
  invalid_argument *this_00;
  logic_error *plVar2;
  element_type *peVar3;
  SourceManager *pSVar4;
  pointer ppVar5;
  raw_key_type *__y;
  pointer ppVar6;
  ParserMetadata *pPVar7;
  CompilationUnitSyntax *pCVar8;
  reference ppMVar9;
  LibraryMapSyntax *pLVar10;
  __shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2> *in_RSI;
  Compilation *in_RDI;
  MemberSyntax *member_1;
  iterator __end4;
  iterator __begin4;
  SyntaxList<slang::syntax::MemberSyntax> *__range4;
  MemberSyntax *member;
  iterator __end3;
  iterator __begin3;
  SyntaxList<slang::syntax::MemberSyntax> *__range3;
  basic_string_view<char,_std::char_traits<char>_> *name;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  flat_hash_set<std::string_view> *__range2_1;
  SyntaxMetadata result;
  type *meta;
  type *n_1;
  const_iterator __end2;
  const_iterator __begin2;
  flat_hash_map<const_syntax::SyntaxNode_*,_Node> *__range2;
  CompilationUnitSymbol *unit;
  SyntaxNode *topNode;
  SyntaxNode *node;
  mapped_type *entry;
  SourceLibrary *lib;
  locator loc;
  size_t pos0;
  size_t hash;
  basic_string_view<char,_std::char_traits<char>_> *k;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  locator loc_1;
  size_t pos0_1;
  size_t hash_1;
  SyntaxNode **k_1;
  uint n_2;
  value_type *p_1;
  value_type *elements_1;
  int mask_1;
  group_type *pg_1;
  size_t pos_1;
  prober pb_1;
  locator loc_2;
  size_t pos0_2;
  size_t hash_2;
  basic_string_view<char,_std::char_traits<char>_> *k_2;
  uint n_3;
  value_type *p_2;
  value_type *elements_2;
  int mask_2;
  group_type *pg_2;
  size_t pos_2;
  prober pb_2;
  Symbol *in_stack_fffffffffffffa28;
  SourceLibrary *in_stack_fffffffffffffa30;
  Compilation *in_stack_fffffffffffffa38;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffa40;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffa48;
  basic_string_view<char,_std::char_traits<char>_> *__x;
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *in_stack_fffffffffffffa50;
  SyntaxNode **in_stack_fffffffffffffa58;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::SourceLibrary_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::SourceLibrary_*>_>_>
  *in_stack_fffffffffffffa60;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
  *this_01;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
  *in_stack_fffffffffffffa68;
  undefined6 in_stack_fffffffffffffa70;
  TokenKind in_stack_fffffffffffffa76;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffa90;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffa98;
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *in_stack_fffffffffffffaa0;
  size_t in_stack_fffffffffffffaa8;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
  *in_stack_fffffffffffffab0;
  __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
  local_528;
  SyntaxList<slang::syntax::MemberSyntax> *local_520;
  MemberSyntax *local_518;
  MemberSyntax **local_510;
  __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
  local_508;
  SyntaxList<slang::syntax::MemberSyntax> *local_500;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
  local_4f8;
  reference local_4e0;
  const_iterator local_4d8;
  const_iterator local_4c8;
  flat_hash_set<std::string_view> *local_4b8;
  element_type *local_4b0;
  NetType *local_4a8;
  _Storage<slang::TimeScale,_true> local_4a0;
  undefined4 uStack_49c;
  UnconnectedDrive local_498;
  bool local_494;
  type *local_490;
  type *local_488;
  reference local_480;
  const_iterator local_478;
  const_iterator local_468;
  ParserMetadata *local_458;
  CompilationUnitSymbol *local_450;
  SyntaxNode *local_448;
  SyntaxNode *local_440;
  __sv_type local_438;
  SourceLibrary **local_428;
  SourceLibrary *local_420;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::SourceLibrary_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_3f8;
  __sv_type *local_3e0;
  flat_hash_map<std::string_view,_const_SourceLibrary_*> *local_3d8;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_3d0;
  type *local_3b8;
  flat_hash_map<const_syntax::SyntaxNode_*,_SyntaxMetadata> *local_3b0;
  reference local_3a8;
  flat_hash_set<std::string_view> *local_3a0;
  undefined1 local_391;
  __sv_type *local_390;
  flat_hash_map<std::string_view,_const_SourceLibrary_*> *local_388;
  bool local_379 [25];
  iterator local_360;
  bool local_349 [25];
  iterator local_330;
  bool local_319;
  iterator local_318;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::SourceLibrary_*>_>
  local_308;
  size_t local_2f0;
  size_t local_2e8;
  basic_string_view<char,_std::char_traits<char>_> *local_2e0;
  __sv_type *local_2d8;
  undefined1 *local_2d0;
  flat_hash_map<std::string_view,_const_SourceLibrary_*> *local_2c8;
  uint local_2bc;
  value_type *local_2b8;
  value_type *local_2b0;
  uint local_2a4;
  group_type *local_2a0;
  size_t local_298;
  pow2_quadratic_prober local_290;
  size_t local_280;
  size_t local_278;
  basic_string_view<char,_std::char_traits<char>_> *local_270;
  basic_string_view<char,_std::char_traits<char>_> *local_268;
  undefined1 local_259;
  type *local_258;
  flat_hash_map<const_syntax::SyntaxNode_*,_SyntaxMetadata> *local_250;
  bool local_241 [25];
  iterator local_228;
  bool local_211 [25];
  iterator local_1f8;
  bool local_1e1;
  iterator local_1e0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>
  local_1d0;
  size_t local_1b8;
  size_t local_1b0;
  SyntaxNode **local_1a8;
  type *local_1a0;
  undefined1 *local_198;
  flat_hash_map<const_syntax::SyntaxNode_*,_SyntaxMetadata> *local_190;
  uint local_184;
  value_type *local_180;
  value_type *local_178;
  uint local_16c;
  group_type *local_168;
  size_t local_160;
  pow2_quadratic_prober local_158;
  size_t local_148;
  size_t local_140;
  SyntaxNode **local_138;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
  *local_130;
  reference local_128;
  flat_hash_set<std::string_view> *local_120;
  bool local_111 [25];
  iterator local_f8;
  bool local_e1 [25];
  iterator local_c8;
  bool local_b1;
  iterator local_b0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_a0;
  size_t local_88;
  size_t local_80;
  Compilation *local_78;
  reference local_70;
  flat_hash_set<std::string_view> *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  Compilation *local_10;
  basic_string_view<char,_std::char_traits<char>_> *local_8;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)in_RSI);
  if (!bVar1) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"tree cannot be null");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if ((in_RDI->finalized & 1U) != 0) {
    plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar2,"The compilation has already been finalized");
    __cxa_throw(plVar2,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  peVar3 = std::
           __shared_ptr_access<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1170cee);
  pSVar4 = slang::syntax::SyntaxTree::sourceManager(peVar3);
  if (pSVar4 != in_RDI->sourceManager) {
    if (in_RDI->sourceManager != (SourceManager *)0x0) {
      plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error
                (plVar2,"All syntax trees added to the compilation must use the same source manager"
                );
      __cxa_throw(plVar2,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    peVar3 = std::
             __shared_ptr_access<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1170d2a);
    pSVar4 = slang::syntax::SyntaxTree::sourceManager(peVar3);
    in_RDI->sourceManager = pSVar4;
  }
  peVar3 = std::
           __shared_ptr_access<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1170db3);
  local_420 = slang::syntax::SyntaxTree::getSourceLibrary(peVar3);
  if (local_420 == (SourceLibrary *)0x0) {
    local_420 = in_RDI->defaultLibPtr;
  }
  else {
    in_stack_fffffffffffffa90 =
         (basic_string_view<char,_std::char_traits<char>_> *)&in_RDI->libraryNameMap;
    local_438 = std::__cxx11::string::operator_cast_to_basic_string_view
                          (&in_stack_fffffffffffffa30->name);
    local_3e0 = &local_438;
    local_2d0 = &local_391;
    local_3d8 = (flat_hash_map<std::string_view,_const_SourceLibrary_*> *)in_stack_fffffffffffffa90;
    local_390 = local_3e0;
    local_388 = (flat_hash_map<std::string_view,_const_SourceLibrary_*> *)in_stack_fffffffffffffa90;
    local_2d8 = local_3e0;
    local_2c8 = (flat_hash_map<std::string_view,_const_SourceLibrary_*> *)in_stack_fffffffffffffa90;
    local_2e0 = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
                ::key_from<std::basic_string_view<char,std::char_traits<char>>>(local_3e0);
    local_2e8 = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
                ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                          ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::SourceLibrary_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::SourceLibrary_*>_>_>
                            *)in_stack_fffffffffffffa30,
                           (basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffffa28);
    local_2f0 = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::SourceLibrary_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::SourceLibrary_*>_>_>
                ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::SourceLibrary_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::SourceLibrary_*>_>_>
                                *)in_stack_fffffffffffffa30,(size_t)in_stack_fffffffffffffa28);
    local_270 = local_2e0;
    local_280 = local_2e8;
    in_stack_fffffffffffffa98 = in_stack_fffffffffffffa90;
    local_278 = local_2f0;
    local_268 = in_stack_fffffffffffffa90;
    boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
              (&local_290,local_2f0);
    do {
      local_298 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_290);
      local_2a0 = boost::unordered::detail::foa::
                  table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::SourceLibrary_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::SourceLibrary_*>_>_>
                  ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::SourceLibrary_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::SourceLibrary_*>_>_>
                            *)0x1170f46);
      local_2a0 = local_2a0 + local_298;
      local_2a4 = boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match
                            ((group15<boost::unordered::detail::foa::plain_integral> *)
                             in_stack_fffffffffffffa38,(size_t)in_stack_fffffffffffffa30);
      if (local_2a4 != 0) {
        local_2b0 = boost::unordered::detail::foa::
                    table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::SourceLibrary_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::SourceLibrary_*>_>_>
                    ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::SourceLibrary_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::SourceLibrary_*>_>_>
                                *)0x1170f91);
        local_2b8 = local_2b0 + local_298 * 0xf;
        do {
          local_2bc = boost::unordered::detail::foa::unchecked_countr_zero(0);
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::SourceLibrary_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::SourceLibrary_*>_>_>
          ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::SourceLibrary_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::SourceLibrary_*>_>_>
                  *)0x1170fe1);
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
          ::
          key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>
                    ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::SourceLibrary_*>
                      *)0x117100e);
          bVar1 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                            ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                             in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,
                             in_stack_fffffffffffffa40);
          if (bVar1) {
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::SourceLibrary_*>_>
            ::table_locator(&local_308,local_2a0,local_2bc,local_2b8 + local_2bc);
            goto LAB_01171102;
          }
          local_2a4 = local_2a4 - 1 & local_2a4;
        } while (local_2a4 != 0);
      }
      bVar1 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                                  in_stack_fffffffffffffa30,(size_t)in_stack_fffffffffffffa28);
      if (bVar1) {
        memset(&local_308,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::SourceLibrary_*>_>
        ::table_locator(&local_308);
        goto LAB_01171102;
      }
      bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                        (&local_290,(size_t)in_stack_fffffffffffffa98->_M_str);
    } while (bVar1);
    memset(&local_308,0,0x18);
    boost::unordered::detail::foa::
    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::SourceLibrary_*>_>
    ::table_locator(&local_308);
LAB_01171102:
    bVar1 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                      ((table_locator *)&local_308);
    if (bVar1) {
      local_318 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::SourceLibrary_*>_>_>
                  ::make_iterator((locator *)0x1171122);
      local_319 = false;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::SourceLibrary_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::SourceLibrary_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                (&local_3f8,&local_318,&local_319);
    }
    else if (in_stack_fffffffffffffa90[2]._M_str < (char *)in_stack_fffffffffffffa90[2]._M_len) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
      ::
      unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                (in_stack_fffffffffffffa60,(size_t)in_stack_fffffffffffffa58,
                 (size_t)in_stack_fffffffffffffa50,(try_emplace_args_t *)in_stack_fffffffffffffa48,
                 in_stack_fffffffffffffa40);
      local_330 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::SourceLibrary_*>_>_>
                  ::make_iterator((locator *)0x11711aa);
      local_349[0] = true;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::SourceLibrary_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::SourceLibrary_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                (&local_3f8,&local_330,local_349);
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::SourceLibrary_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::SourceLibrary_*>_>_>
                  *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,
                 (try_emplace_args_t *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
      local_360 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::SourceLibrary_*>_>_>
                  ::make_iterator((locator *)0x1171218);
      local_379[0] = true;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::SourceLibrary_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::SourceLibrary_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                (&local_3f8,&local_360,local_379);
    }
    ppVar5 = boost::unordered::detail::foa::
             table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::SourceLibrary_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
             ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::SourceLibrary_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                           *)in_stack_fffffffffffffa30);
    local_428 = &ppVar5->second;
    *local_428 = local_420;
  }
  peVar3 = std::
           __shared_ptr_access<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x11712a1);
  local_440 = slang::syntax::SyntaxTree::root(peVar3);
  for (local_448 = local_440; local_448->parent != (SyntaxNode *)0x0; local_448 = local_448->parent)
  {
  }
  local_450 = BumpAllocator::
              emplace<slang::ast::CompilationUnitSymbol,slang::ast::Compilation&,slang::SourceLibrary_const&>
                        ((BumpAllocator *)in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                         in_stack_fffffffffffffa30);
  Symbol::setSyntax(&local_450->super_Symbol,local_448);
  std::unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>::operator->
            ((unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_> *)
             0x117132f);
  Scope::addMember((Scope *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
  std::
  vector<const_slang::ast::CompilationUnitSymbol_*,_std::allocator<const_slang::ast::CompilationUnitSymbol_*>_>
  ::push_back((vector<const_slang::ast::CompilationUnitSymbol_*,_std::allocator<const_slang::ast::CompilationUnitSymbol_*>_>
               *)in_stack_fffffffffffffa40,(value_type *)in_stack_fffffffffffffa38);
  std::__shared_ptr_access<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x117136c);
  local_458 = slang::syntax::SyntaxTree::getMetadata((SyntaxTree *)0x1171374);
  local_468 = boost::unordered::
              unordered_flat_map<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
              ::begin((unordered_flat_map<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
                       *)0x1171389);
  local_478 = boost::unordered::
              unordered_flat_map<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
              ::end((unordered_flat_map<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
                     *)0x11713a6);
  do {
    bVar1 = boost::unordered::detail::foa::operator!=
                      ((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                        *)in_stack_fffffffffffffa30,
                       (table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                        *)in_stack_fffffffffffffa28);
    if (!bVar1) {
      std::__shared_ptr_access<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x117198e);
      pPVar7 = slang::syntax::SyntaxTree::getMetadata((SyntaxTree *)0x1171996);
      local_4b8 = &pPVar7->globalInstances;
      local_4c8 = boost::unordered::
                  unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ::begin((unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           *)0x11719af);
      local_4d8 = boost::unordered::
                  unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ::end((unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         *)0x11719cc);
      do {
        bVar1 = boost::unordered::detail::foa::operator!=
                          ((table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                            *)in_stack_fffffffffffffa30,
                           (table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                            *)in_stack_fffffffffffffa28);
        if (!bVar1) {
          if (local_440->kind == CompilationUnit) {
            pCVar8 = slang::syntax::SyntaxNode::as<slang::syntax::CompilationUnitSyntax>(local_440);
            local_500 = &pCVar8->members;
            local_508._M_current =
                 (MemberSyntax **)
                 std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::begin
                           ((span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *)
                            in_stack_fffffffffffffa28);
            local_510 = (MemberSyntax **)
                        std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::end
                                  ((span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *)
                                   in_stack_fffffffffffffa38);
            while (bVar1 = __gnu_cxx::
                           operator==<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                                     ((__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                                       *)in_stack_fffffffffffffa30,
                                      (__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                                       *)in_stack_fffffffffffffa28), ((bVar1 ^ 0xffU) & 1) != 0) {
              ppMVar9 = __gnu_cxx::
                        __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                        ::operator*(&local_508);
              local_518 = *ppMVar9;
              CompilationUnitSymbol::addMembers
                        ((CompilationUnitSymbol *)
                         CONCAT26(in_stack_fffffffffffffa76,in_stack_fffffffffffffa70),
                         (SyntaxNode *)in_stack_fffffffffffffa68);
              __gnu_cxx::
              __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
              ::operator++(&local_508);
            }
          }
          else if (local_440->kind == LibraryMap) {
            pLVar10 = slang::syntax::SyntaxNode::as<slang::syntax::LibraryMapSyntax>(local_440);
            local_520 = &pLVar10->members;
            local_528._M_current =
                 (MemberSyntax **)
                 std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::begin
                           ((span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *)
                            in_stack_fffffffffffffa28);
            std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::end
                      ((span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *)
                       in_stack_fffffffffffffa38);
            while (bVar1 = __gnu_cxx::
                           operator==<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                                     ((__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                                       *)in_stack_fffffffffffffa30,
                                      (__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                                       *)in_stack_fffffffffffffa28), ((bVar1 ^ 0xffU) & 1) != 0) {
              __gnu_cxx::
              __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
              ::operator*(&local_528);
              CompilationUnitSymbol::addMembers
                        ((CompilationUnitSymbol *)
                         CONCAT26(in_stack_fffffffffffffa76,in_stack_fffffffffffffa70),
                         (SyntaxNode *)in_stack_fffffffffffffa68);
              __gnu_cxx::
              __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
              ::operator++(&local_528);
            }
          }
          else {
            CompilationUnitSymbol::addMembers
                      ((CompilationUnitSymbol *)
                       CONCAT26(in_stack_fffffffffffffa76,in_stack_fffffffffffffa70),
                       (SyntaxNode *)in_stack_fffffffffffffa68);
          }
          std::
          vector<std::shared_ptr<slang::syntax::SyntaxTree>,std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>>>
          ::emplace_back<std::shared_ptr<slang::syntax::SyntaxTree>>
                    ((vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
                      *)in_stack_fffffffffffffa40,
                     (shared_ptr<slang::syntax::SyntaxTree> *)in_stack_fffffffffffffa38);
          std::optional<slang::Diagnostics>::reset((optional<slang::Diagnostics> *)0x1172010);
          return;
        }
        local_4e0 = boost::unordered::detail::foa::
                    table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                    ::operator*((table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                                 *)in_stack_fffffffffffffa30);
        in_stack_fffffffffffffa40 =
             (basic_string_view<char,_std::char_traits<char>_> *)&in_RDI->globalInstantiations;
        local_3a8 = local_4e0;
        local_3a0 = (flat_hash_set<std::string_view> *)in_stack_fffffffffffffa40;
        local_128 = local_4e0;
        local_120 = (flat_hash_set<std::string_view> *)in_stack_fffffffffffffa40;
        local_70 = local_4e0;
        local_68 = (flat_hash_set<std::string_view> *)in_stack_fffffffffffffa40;
        local_78 = (Compilation *)
                   boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                   ::key_from<std::basic_string_view<char,std::char_traits<char>>>
                             ((basic_string_view<char,_std::char_traits<char>_> *)0x1171a90);
        local_80 = boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                   ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                             ((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                               *)in_stack_fffffffffffffa30,
                              (basic_string_view<char,_std::char_traits<char>_> *)
                              in_stack_fffffffffffffa28);
        local_88 = boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ::position_for((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                   *)in_stack_fffffffffffffa30,(size_t)in_stack_fffffffffffffa28);
        local_10 = local_78;
        local_20 = local_80;
        __x = in_stack_fffffffffffffa40;
        local_18 = local_88;
        local_8 = in_stack_fffffffffffffa40;
        boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                  (&local_30,local_88);
        do {
          local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
          local_40 = boost::unordered::detail::foa::
                     table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ::groups((table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                               *)0x1171b4a);
          local_40 = local_40 + local_38;
          local_44 = boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::match
                               ((group15<boost::unordered::detail::foa::plain_integral> *)
                                in_stack_fffffffffffffa38,(size_t)in_stack_fffffffffffffa30);
          if (local_44 != 0) {
            local_50 = boost::unordered::detail::foa::
                       table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ::elements((table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                   *)0x1171b95);
            local_58 = local_50 + local_38 * 0xf;
            do {
              local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
              in_stack_fffffffffffffa30 =
                   (SourceLibrary *)
                   boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ::pred((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           *)0x1171be5);
              in_stack_fffffffffffffa38 = local_10;
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
              ::key_from<std::basic_string_view<char,std::char_traits<char>>>
                        ((basic_string_view<char,_std::char_traits<char>_> *)0x1171c12);
              bVar1 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                      operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *
                                 )in_stack_fffffffffffffa50,__x,in_stack_fffffffffffffa40);
              if (bVar1) {
                boost::unordered::detail::foa::
                table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                ::table_locator(&local_a0,local_40,local_5c,local_58 + local_5c);
                goto LAB_01171d06;
              }
              local_44 = local_44 - 1 & local_44;
            } while (local_44 != 0);
          }
          bVar1 = boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                            ((group15<boost::unordered::detail::foa::plain_integral> *)
                             in_stack_fffffffffffffa30,(size_t)in_stack_fffffffffffffa28);
          if (bVar1) {
            memset(&local_a0,0,0x18);
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
            ::table_locator(&local_a0);
            goto LAB_01171d06;
          }
          bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                            (&local_30,(size_t)__x->_M_str);
        } while (bVar1);
        memset(&local_a0,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
        ::table_locator(&local_a0);
LAB_01171d06:
        bVar1 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                          ((table_locator *)&local_a0);
        if (bVar1) {
          local_b0 = boost::unordered::detail::foa::
                     table<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ::make_iterator((locator *)0x1171d26);
          local_b1 = false;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                    (&local_4f8,&local_b0,&local_b1);
        }
        else if (in_stack_fffffffffffffa40[2]._M_str < (char *)in_stack_fffffffffffffa40[2]._M_len)
        {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
          ::unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>const&>
                    (in_stack_fffffffffffffa50,(size_t)__x,(size_t)in_stack_fffffffffffffa40,
                     (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffa38);
          local_c8 = boost::unordered::detail::foa::
                     table<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ::make_iterator((locator *)0x1171da6);
          local_e1[0] = true;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                    (&local_4f8,&local_c8,local_e1);
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
          ::unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>const&>
                    (in_stack_fffffffffffffaa0,(size_t)in_stack_fffffffffffffa98,
                     in_stack_fffffffffffffa90);
          local_f8 = boost::unordered::detail::foa::
                     table<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ::make_iterator((locator *)0x1171e0c);
          local_111[0] = true;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                    (&local_4f8,&local_f8,local_111);
        }
        boost::unordered::detail::foa::
        table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
        ::operator++((table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                      *)in_stack_fffffffffffffa30);
      } while( true );
    }
    local_480 = boost::unordered::detail::foa::
                table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                ::operator*((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                             *)in_stack_fffffffffffffa30);
    local_488 = std::
                get<0ul,slang::syntax::SyntaxNode_const*const,slang::parsing::ParserMetadata::Node>
                          ((pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>
                            *)0x11713f6);
    local_490 = std::
                get<1ul,slang::syntax::SyntaxNode_const*const,slang::parsing::ParserMetadata::Node>
                          ((pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>
                            *)0x117140b);
    SyntaxMetadata::SyntaxMetadata((SyntaxMetadata *)in_stack_fffffffffffffa30);
    local_4b0 = std::__shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>::get
                          (in_RSI);
    local_4a8 = getNetType(in_RDI,(TokenKind)((ulong)in_RSI >> 0x30));
    uStack_49c = CONCAT31(uStack_49c._1_3_,
                          (local_490->timeScale).super__Optional_base<slang::TimeScale,_true,_true>.
                          _M_payload.super__Optional_payload_base<slang::TimeScale>._M_engaged);
    local_4a0 = (local_490->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload
                .super__Optional_payload_base<slang::TimeScale>._M_payload;
    in_stack_fffffffffffffa76 = local_490->unconnectedDrive;
    if (in_stack_fffffffffffffa76 == Pull0Keyword) {
      local_498 = Pull0;
    }
    else if (in_stack_fffffffffffffa76 == Pull1Keyword) {
      local_498 = Pull1;
    }
    else {
      local_498 = None;
    }
    local_494 = (bool)(local_490->cellDefine & 1);
    this_01 = (table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
               *)&in_RDI->syntaxMetadata;
    local_3b8 = local_488;
    local_258 = local_488;
    local_198 = &local_259;
    local_1a0 = local_488;
    local_3b0 = (flat_hash_map<const_syntax::SyntaxNode_*,_SyntaxMetadata> *)this_01;
    local_250 = (flat_hash_map<const_syntax::SyntaxNode_*,_SyntaxMetadata> *)this_01;
    local_190 = (flat_hash_map<const_syntax::SyntaxNode_*,_SyntaxMetadata> *)this_01;
    local_1a8 = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
                ::key_from<slang::syntax::SyntaxNode_const*>(local_488);
    local_1b0 = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
                ::hash_for<slang::syntax::SyntaxNode_const*>
                          ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
                            *)in_stack_fffffffffffffa30,(SyntaxNode **)in_stack_fffffffffffffa28);
    local_1b8 = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
                ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
                                *)in_stack_fffffffffffffa30,(size_t)in_stack_fffffffffffffa28);
    local_138 = local_1a8;
    local_148 = local_1b0;
    in_stack_fffffffffffffa68 = this_01;
    local_140 = local_1b8;
    local_130 = this_01;
    boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
              (&local_158,local_1b8);
    do {
      local_160 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_158);
      local_168 = boost::unordered::detail::foa::
                  table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
                  ::groups((table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
                            *)0x1171623);
      local_168 = local_168 + local_160;
      local_16c = boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match
                            ((group15<boost::unordered::detail::foa::plain_integral> *)
                             in_stack_fffffffffffffa38,(size_t)in_stack_fffffffffffffa30);
      if (local_16c != 0) {
        local_178 = boost::unordered::detail::foa::
                    table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
                    ::elements((table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
                                *)0x117166e);
        local_180 = local_178 + local_160 * 0xf;
        do {
          local_184 = boost::unordered::detail::foa::unchecked_countr_zero(0);
          in_stack_fffffffffffffa50 =
               (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
                  ::pred((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
                          *)0x11716be);
          in_stack_fffffffffffffa58 = local_138;
          __y = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
                ::
                key_from<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>
                          ((pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>
                            *)0x11716eb);
          bVar1 = std::equal_to<const_slang::syntax::SyntaxNode_*>::operator()
                            ((equal_to<const_slang::syntax::SyntaxNode_*> *)
                             in_stack_fffffffffffffa50,in_stack_fffffffffffffa58,__y);
          if (bVar1) {
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>
            ::table_locator(&local_1d0,local_168,local_184,local_180 + local_184);
            goto LAB_011717df;
          }
          local_16c = local_16c - 1 & local_16c;
        } while (local_16c != 0);
      }
      bVar1 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                                  in_stack_fffffffffffffa30,(size_t)in_stack_fffffffffffffa28);
      if (bVar1) {
        memset(&local_1d0,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>
        ::table_locator(&local_1d0);
        goto LAB_011717df;
      }
      bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                        (&local_158,(in_stack_fffffffffffffa68->arrays).groups_size_mask);
    } while (bVar1);
    memset(&local_1d0,0,0x18);
    boost::unordered::detail::foa::
    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>
    ::table_locator(&local_1d0);
LAB_011717df:
    bVar1 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                      ((table_locator *)&local_1d0);
    if (bVar1) {
      local_1e0 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
                  ::make_iterator((locator *)0x11717ff);
      local_1e1 = false;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                (&local_3d0,&local_1e0,&local_1e1);
    }
    else if ((this_01->size_ctrl).size < (this_01->size_ctrl).ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
      ::
      unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*const&>
                (this_01,(size_t)in_stack_fffffffffffffa58,(size_t)in_stack_fffffffffffffa50,
                 (try_emplace_args_t *)in_stack_fffffffffffffa48,
                 (SyntaxNode **)in_stack_fffffffffffffa40);
      local_1f8 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
                  ::make_iterator((locator *)0x1171887);
      local_211[0] = true;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                (&local_3d0,&local_1f8,local_211);
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*const&>
                (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,
                 (try_emplace_args_t *)in_stack_fffffffffffffaa0,
                 (SyntaxNode **)in_stack_fffffffffffffa98);
      local_228 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
                  ::make_iterator((locator *)0x11718f5);
      local_241[0] = true;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                (&local_3d0,&local_228,local_241);
    }
    ppVar6 = boost::unordered::detail::foa::
             table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
             ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                           *)in_stack_fffffffffffffa30);
    (ppVar6->second).tree = local_4b0;
    (ppVar6->second).defaultNetType = local_4a8;
    *(ulong *)&(ppVar6->second).timeScale = CONCAT44(uStack_49c,local_4a0);
    (ppVar6->second).unconnectedDrive = local_498;
    (ppVar6->second).cellDefine = local_494;
    boost::unordered::detail::foa::
    table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
    ::operator++((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                  *)in_stack_fffffffffffffa30);
  } while( true );
}

Assistant:

void Compilation::addSyntaxTree(std::shared_ptr<SyntaxTree> tree) {
    SLANG_ASSERT(!isFrozen());

    if (!tree)
        SLANG_THROW(std::invalid_argument("tree cannot be null"));

    if (finalized)
        SLANG_THROW(std::logic_error("The compilation has already been finalized"));

    if (&tree->sourceManager() != sourceManager) {
        if (!sourceManager)
            sourceManager = &tree->sourceManager();
        else {
            SLANG_THROW(std::logic_error(
                "All syntax trees added to the compilation must use the same source manager"));
        }
    }

    auto lib = tree->getSourceLibrary();
    if (lib) {
        auto& entry = libraryNameMap[lib->name];
        SLANG_ASSERT(entry == nullptr || entry == lib);
        entry = lib;
    }
    else {
        lib = defaultLibPtr;
    }

    const SyntaxNode& node = tree->root();
    const SyntaxNode* topNode = &node;
    while (topNode->parent)
        topNode = topNode->parent;

    auto unit = emplace<CompilationUnitSymbol>(*this, *lib);
    unit->setSyntax(*topNode);
    root->addMember(*unit);
    compilationUnits.push_back(unit);

    for (auto& [n, meta] : tree->getMetadata().nodeMap) {
        SyntaxMetadata result;
        result.tree = tree.get();
        result.defaultNetType = &getNetType(meta.defaultNetType);
        result.timeScale = meta.timeScale;

        switch (meta.unconnectedDrive) {
            case TokenKind::Pull0Keyword:
                result.unconnectedDrive = UnconnectedDrive::Pull0;
                break;
            case TokenKind::Pull1Keyword:
                result.unconnectedDrive = UnconnectedDrive::Pull1;
                break;
            default:
                result.unconnectedDrive = UnconnectedDrive::None;
                break;
        }

        result.cellDefine = meta.cellDefine;

        syntaxMetadata[n] = result;
    }

    for (auto& name : tree->getMetadata().globalInstances)
        globalInstantiations.emplace(name);

    if (node.kind == SyntaxKind::CompilationUnit) {
        for (auto member : node.as<CompilationUnitSyntax>().members)
            unit->addMembers(*member);
    }
    else if (node.kind == SyntaxKind::LibraryMap) {
        for (auto member : node.as<LibraryMapSyntax>().members)
            unit->addMembers(*member);
    }
    else {
        unit->addMembers(node);
    }

    syntaxTrees.emplace_back(std::move(tree));
    cachedParseDiagnostics.reset();
}